

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DecoratorGradient.cpp
# Opt level: O0

SharedPtr<Decorator> __thiscall
Rml::DecoratorRadialGradientInstancer::InstanceDecorator
          (DecoratorRadialGradientInstancer *this,String *name,PropertyDictionary *properties_,
          DecoratorInstancerInterface *param_3)

{
  Vector2Numeric in_size;
  bool bVar1;
  Units units;
  Property *pPVar2;
  Property *this_00;
  Property *this_01;
  reference ppPVar3;
  element_type *this_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  Property *extraout_RDX_01;
  Property *extraout_RDX_02;
  Property *extraout_RDX_03;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_04;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_05;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  Vector2Numeric in_position;
  SharedPtr<Decorator> SVar5;
  Array<const_Property_*,_2> p_position_00;
  bool local_121;
  undefined1 local_d0 [8];
  SharedPtr<Rml::DecoratorRadialGradient> decorator;
  ColorStopList *color_stop_list;
  bool repeating;
  Vector2Numeric position;
  undefined1 auStack_7c [8];
  Vector2Numeric size;
  SizeType size_type;
  bool circle_sized;
  Shape shape;
  Property *p_color_stop_list;
  Array<const_Property_*,_2> p_position;
  Property *p_size_y;
  Property *p_size_x;
  Property *p_ending_shape;
  DecoratorInstancerInterface *param_5_local;
  PropertyDictionary *properties__local;
  String *name_local;
  DecoratorRadialGradientInstancer *this_local;
  
  pPVar2 = PropertyDictionary::GetProperty
                     ((PropertyDictionary *)param_3,name[3].field_2._M_local_buf[8]);
  this_00 = PropertyDictionary::GetProperty
                      ((PropertyDictionary *)param_3,name[3].field_2._M_local_buf[9]);
  p_position._M_elems[1] =
       PropertyDictionary::GetProperty
                 ((PropertyDictionary *)param_3,name[3].field_2._M_local_buf[10]);
  p_color_stop_list =
       PropertyDictionary::GetProperty
                 ((PropertyDictionary *)param_3,name[3].field_2._M_local_buf[0xb]);
  p_position._M_elems[0] =
       PropertyDictionary::GetProperty
                 ((PropertyDictionary *)param_3,name[3].field_2._M_local_buf[0xc]);
  this_01 = PropertyDictionary::GetProperty
                      ((PropertyDictionary *)param_3,name[3].field_2._M_local_buf[0xd]);
  if (((((pPVar2 == (Property *)0x0) || (this_00 == (Property *)0x0)) ||
       (p_position._M_elems[1] == (Property *)0x0)) ||
      ((ppPVar3 = ::std::array<const_Rml::Property_*,_2UL>::operator[]
                            ((array<const_Rml::Property_*,_2UL> *)&p_color_stop_list,0),
       *ppPVar3 == (value_type)0x0 ||
       (ppPVar3 = ::std::array<const_Rml::Property_*,_2UL>::operator[]
                            ((array<const_Rml::Property_*,_2UL> *)&p_color_stop_list,1),
       *ppPVar3 == (value_type)0x0)))) || (this_01 == (Property *)0x0)) {
    ::std::shared_ptr<Rml::Decorator>::shared_ptr((shared_ptr<Rml::Decorator> *)this,(nullptr_t)0x0)
    ;
    _Var4._M_pi = extraout_RDX;
  }
  else {
    size_type = Property::Get<int>(pPVar2);
    if (size_type == ClosestCorner) {
      units = operator&(this_00->unit,LENGTH_PERCENT);
      bVar1 = Any(units);
      local_121 = false;
      if (bVar1) {
        local_121 = p_position._M_elems[1]->unit == KEYWORD;
      }
      size.y.unit._3_1_ = local_121;
      size_type = (SizeType)(local_121 == false);
    }
    if ((size_type == ClosestSide) &&
       ((this_00->unit == PERCENT || (p_position._M_elems[1]->unit != KEYWORD)))) {
      ::std::shared_ptr<Rml::Decorator>::shared_ptr
                ((shared_ptr<Rml::Decorator> *)this,(nullptr_t)0x0);
      _Var4._M_pi = extraout_RDX_00;
    }
    else {
      size.y.number = 0.0;
      Vector2<Rml::NumericValue>::Vector2((Vector2<Rml::NumericValue> *)auStack_7c);
      if (this_00->unit == KEYWORD) {
        size.y.number = (float)Property::Get<int>(this_00);
        pPVar2 = extraout_RDX_01;
      }
      else {
        size.y.number = 5.60519e-45;
        position.y = Property::GetNumericValue(this_00);
        pPVar2 = extraout_RDX_02;
        auStack_7c = (undefined1  [8])position.y;
        if (p_position._M_elems[1]->unit != KEYWORD) {
          position.y = Property::GetNumericValue(p_position._M_elems[1]);
          pPVar2 = extraout_RDX_03;
        }
        size.x = position.y;
      }
      p_position_00._M_elems[1] = pPVar2;
      p_position_00._M_elems[0] = p_position._M_elems[0];
      in_position = ComputePosition((Rml *)p_color_stop_list,p_position_00);
      bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )properties_,"repeating-radial-gradient");
      if (this_01->unit == COLORSTOPLIST) {
        decorator.super___shared_ptr<Rml::DecoratorRadialGradient,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             Variant::GetReference<std::vector<Rml::ColorStop,std::allocator<Rml::ColorStop>>>
                       (&this_01->value);
        MakeShared<Rml::DecoratorRadialGradient>();
        this_02 = ::std::
                  __shared_ptr_access<Rml::DecoratorRadialGradient,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<Rml::DecoratorRadialGradient,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)local_d0);
        in_size.y = size.x;
        in_size.x.number = (float)auStack_7c._0_4_;
        in_size.x.unit = auStack_7c._4_4_;
        bVar1 = DecoratorRadialGradient::Initialise
                          (this_02,bVar1,size_type,(SizeType)size.y.number,in_size,in_position,
                           (ColorStopList *)
                           decorator.
                           super___shared_ptr<Rml::DecoratorRadialGradient,_(__gnu_cxx::_Lock_policy)2>
                           ._M_refcount._M_pi);
        if (bVar1) {
          ::std::shared_ptr<Rml::Decorator>::shared_ptr<Rml::DecoratorRadialGradient,void>
                    ((shared_ptr<Rml::Decorator> *)this,
                     (shared_ptr<Rml::DecoratorRadialGradient> *)local_d0);
        }
        else {
          ::std::shared_ptr<Rml::Decorator>::shared_ptr
                    ((shared_ptr<Rml::Decorator> *)this,(nullptr_t)0x0);
        }
        ::std::shared_ptr<Rml::DecoratorRadialGradient>::~shared_ptr
                  ((shared_ptr<Rml::DecoratorRadialGradient> *)local_d0);
        _Var4._M_pi = extraout_RDX_05;
      }
      else {
        ::std::shared_ptr<Rml::Decorator>::shared_ptr
                  ((shared_ptr<Rml::Decorator> *)this,(nullptr_t)0x0);
        _Var4._M_pi = extraout_RDX_04;
      }
    }
  }
  SVar5.super___shared_ptr<Rml::Decorator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var4._M_pi;
  SVar5.super___shared_ptr<Rml::Decorator,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this
  ;
  return (SharedPtr<Decorator>)SVar5.super___shared_ptr<Rml::Decorator,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

SharedPtr<Decorator> DecoratorRadialGradientInstancer::InstanceDecorator(const String& name, const PropertyDictionary& properties_,
	const DecoratorInstancerInterface& /*interface_*/)
{
	const Property* p_ending_shape = properties_.GetProperty(ids.ending_shape);
	const Property* p_size_x = properties_.GetProperty(ids.size_x);
	const Property* p_size_y = properties_.GetProperty(ids.size_y);
	Array<const Property*, 2> p_position = {properties_.GetProperty(ids.position_x), properties_.GetProperty(ids.position_y)};
	const Property* p_color_stop_list = properties_.GetProperty(ids.color_stop_list);

	if (!p_ending_shape || !p_size_x || !p_size_y || !p_position[0] || !p_position[1] || !p_color_stop_list)
		return nullptr;

	using SizeType = DecoratorRadialGradient::SizeType;
	using Shape = DecoratorRadialGradient::Shape;

	Shape shape = (Shape)p_ending_shape->Get<int>();
	if (shape == Shape::Unspecified)
	{
		const bool circle_sized = (Any(p_size_x->unit & Unit::LENGTH_PERCENT) && p_size_y->unit == Unit::KEYWORD);
		shape = (circle_sized ? Shape::Circle : Shape::Ellipse);
	}
	if (shape == Shape::Circle && (p_size_x->unit == Unit::PERCENT || p_size_y->unit != Unit::KEYWORD))
		return nullptr;

	SizeType size_type = {};
	Vector2Numeric size;
	if (p_size_x->unit == Unit::KEYWORD)
	{
		size_type = (SizeType)p_size_x->Get<int>();
	}
	else
	{
		size_type = SizeType::LengthPercentage;
		size.x = p_size_x->GetNumericValue();
		size.y = (p_size_y->unit == Unit::KEYWORD ? size.x : p_size_y->GetNumericValue());
	}

	const Vector2Numeric position = ComputePosition(p_position);
	const bool repeating = (name == "repeating-radial-gradient");

	if (p_color_stop_list->unit != Unit::COLORSTOPLIST)
		return nullptr;
	const ColorStopList& color_stop_list = p_color_stop_list->value.GetReference<ColorStopList>();

	auto decorator = MakeShared<DecoratorRadialGradient>();
	if (decorator->Initialise(repeating, shape, size_type, size, position, color_stop_list))
		return decorator;

	return nullptr;
}